

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O2

void __thiscall cppforth::Forth::filePosition(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  long lVar2;
  undefined8 uVar3;
  allocator<char> local_51;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  string local_40 [32];
  
  requireDStackDepth(this,1,"FILE-POSITION");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  std::__cxx11::string::string<std::allocator<char>>(local_40,"FILE-POSITION",&local_51);
  GetFileHandle((Forth *)&f,(Cell)this,(string *)(ulong)uVar1,(errorCodes)local_40);
  std::__cxx11::string::~string(local_40);
  lVar2 = *(long *)(*(long *)f.
                             super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + -0x18);
  if (*(int *)(f.
               super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr + lVar2 + 0x20) != 0) {
    std::ios::clear((int)f.
                         super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + (int)lVar2);
    lVar2 = *(long *)(*(long *)f.
                               super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + -0x18);
  }
  std::ios::clear((int)lVar2 +
                  (int)f.
                       super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
  uVar3 = std::istream::tellg();
  ForthStack<unsigned_int>::setTop(this_00,0,(uint)uVar3);
  ForthStack<unsigned_int>::push(this_00,(uint)((ulong)uVar3 >> 0x20));
  ForthStack<unsigned_int>::push
            (this_00,-(*(uint *)(f.
                                 super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr +
                                *(long *)(*(long *)f.
                                                  super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr + -0x18) + 0x20) & 1) & 0xffffffbf);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f.
              super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void filePosition() {
	REQUIRE_DSTACK_DEPTH(1, "FILE-POSITION");
	auto h = (dStack.getTop()); 
	auto f = GetFileHandle(h, "FILE-POSITION", errorFileSize);
	auto status = f->rdstate();
	if (status != 0) f->clear();
	f->clear();
	DCell position(f->tellg());
	status = f->rdstate();
	dStack.setTop(0, position.data_.Cells.lo);
	dStack.push(position.data_.Cells.hi);
	dStack.push(f->bad() ? Cell(errorFilePosition) : 0);
}